

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O1

const_iterator __thiscall QSet<QGraphicsItem_*>::begin(QSet<QGraphicsItem_*> *this)

{
  Data *pDVar1;
  Data *pDVar2;
  Data *pDVar3;
  long *in_RSI;
  const_iterator cVar4;
  
  pDVar2 = (Data *)*in_RSI;
  if (pDVar2 == (Data *)0x0) {
    pDVar2 = (Data *)0x0;
  }
  else if (pDVar2->spans->offsets[0] == 0xff) {
    pDVar1 = (Data *)0x1;
    do {
      pDVar3 = pDVar1;
      if ((Data *)pDVar2->numBuckets == pDVar3) {
        pDVar2 = (Data *)0x0;
        pDVar3 = (Data *)0x0;
        break;
      }
      pDVar1 = (Data *)((long)&(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i + 1);
    } while (pDVar2->spans[(ulong)pDVar3 >> 7].offsets[(uint)pDVar3 & 0x7f] == 0xff);
    goto LAB_005fa915;
  }
  pDVar3 = (Data *)0x0;
LAB_005fa915:
  (this->q_hash).d = pDVar2;
  this[1].q_hash.d = pDVar3;
  cVar4.i.i.bucket = (size_t)pDVar3;
  cVar4.i.i.d = (Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *)this;
  return (const_iterator)cVar4.i.i;
}

Assistant:

inline const_iterator begin() const noexcept { return q_hash.begin(); }